

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
 __thiscall spvtools::opt::analysis::VectorConstant::CopyVectorConstant(VectorConstant *this)

{
  pointer pVVar1;
  pointer pVVar2;
  const_iterator __first;
  const_iterator __last;
  long in_RSI;
  __normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
  local_38;
  const_iterator local_30;
  Vector *local_28;
  undefined1 local_19;
  VectorConstant *this_local;
  unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
  *another;
  
  local_19 = 0;
  this_local = this;
  local_28 = (Vector *)(**(code **)(**(long **)(in_RSI + 8) + 0x70))();
  MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*>
            ((spvtools *)this,&local_28);
  pVVar1 = std::
           unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
           ::operator->((unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
                         *)this);
  pVVar2 = std::
           unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
           ::operator->((unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
                         *)this);
  local_38._M_current =
       (Constant **)
       std::
       vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
       ::end(&(pVVar2->super_CompositeConstant).components_);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>
  ::__normal_iterator<spvtools::opt::analysis::Constant_const**>
            ((__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>
              *)&local_30,&local_38);
  __first = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)(in_RSI + 0x10));
  __last = std::
           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)(in_RSI + 0x10));
  std::
  vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,void>
            ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
              *)&(pVVar1->super_CompositeConstant).components_,local_30,
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )__last._M_current);
  return (__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VectorConstant> CopyVectorConstant() const {
    auto another = MakeUnique<VectorConstant>(type_->AsVector());
    another->components_.insert(another->components_.end(), components_.begin(),
                                components_.end());
    return another;
  }